

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtmd.cpp
# Opt level: O2

int32_t mtmd_helper_eval(mtmd_context *ctx,llama_context *lctx,mtmd_input_chunks *chunks,
                        llama_pos pos0,llama_seq_id seq_id,int32_t n_batch)

{
  pointer pmVar1;
  mtmd_image_tokens *pmVar2;
  pointer pfVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int32_t iVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  pointer pmVar13;
  char *pcVar14;
  undefined8 uVar15;
  pointer piVar16;
  pointer piVar17;
  pointer pmVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  int local_158;
  llama_batch text_batch;
  decode_embd_batch batch_img;
  
  uVar21 = (ulong)(uint)pos0;
  llama_batch_init(&text_batch,n_batch,0,1);
  iVar5 = clip_n_mmproj_embd(ctx->ctx_clip);
  pmVar18 = (chunks->super__Vector_base<mtmd_input_chunk,_std::allocator<mtmd_input_chunk>_>).
            _M_impl.super__Vector_impl_data._M_start;
  pmVar1 = (chunks->super__Vector_base<mtmd_input_chunk,_std::allocator<mtmd_input_chunk>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  do {
    if (pmVar18 == pmVar1) {
      iVar6 = 0;
LAB_00138de7:
      llama_batch_free();
      return iVar6;
    }
    pmVar13 = (chunks->super__Vector_base<mtmd_input_chunk,_std::allocator<mtmd_input_chunk>_>).
              _M_impl.super__Vector_impl_data._M_finish + -1;
    if (pmVar18->type == MTMD_INPUT_CHUNK_TYPE_IMAGE) {
      if (pmVar18 == pmVar13) {
        pcVar14 = "!is_last && \"logits for last image chunk is not yet support\"";
        uVar15 = 0x1fc;
LAB_00138eaf:
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/llava/mtmd.cpp"
                   ,uVar15,"GGML_ASSERT(%s) failed",pcVar14);
      }
      if ((pmVar18->tokens_image)._M_t.
          super___uniq_ptr_impl<mtmd_image_tokens,_mtmd_image_tokens_deleter>._M_t.
          super__Tuple_impl<0UL,_mtmd_image_tokens_*,_mtmd_image_tokens_deleter>.
          super__Head_base<0UL,_mtmd_image_tokens_*,_false>._M_head_impl == (mtmd_image_tokens *)0x0
         ) {
        pcVar14 = "chunk.tokens_image != nullptr";
        uVar15 = 0x1fd;
        goto LAB_00138eaf;
      }
      lVar11 = ggml_time_ms();
      if ((ctx->print_timings == true) && ((int)g_logger_state.verbosity_thold < 3)) {
        clip_log_internal(GGML_LOG_LEVEL_INFO,"encoding image or slice...\n");
      }
      iVar7 = mtmd_encode(ctx,(pmVar18->tokens_image)._M_t.
                              super___uniq_ptr_impl<mtmd_image_tokens,_mtmd_image_tokens_deleter>.
                              _M_t.
                              super__Tuple_impl<0UL,_mtmd_image_tokens_*,_mtmd_image_tokens_deleter>
                              .super__Head_base<0UL,_mtmd_image_tokens_*,_false>._M_head_impl);
      if (iVar7 != 0) {
        if ((int)g_logger_state.verbosity_thold < 5) {
          pcVar14 = "failed to encode image\n";
          iVar6 = 1;
LAB_00138dda:
          clip_log_internal(GGML_LOG_LEVEL_ERROR,pcVar14);
        }
        else {
          iVar6 = 1;
        }
        goto LAB_00138de7;
      }
      if ((ctx->print_timings == true) && ((int)g_logger_state.verbosity_thold < 3)) {
        lVar12 = ggml_time_ms();
        clip_log_internal(GGML_LOG_LEVEL_INFO,"image/slice encoded in %ld ms\n",lVar12 - lVar11);
      }
      pmVar2 = (pmVar18->tokens_image)._M_t.
               super___uniq_ptr_impl<mtmd_image_tokens,_mtmd_image_tokens_deleter>._M_t.
               super__Tuple_impl<0UL,_mtmd_image_tokens_*,_mtmd_image_tokens_deleter>.
               super__Head_base<0UL,_mtmd_image_tokens_*,_false>._M_head_impl;
      iVar6 = pmVar2->ny * pmVar2->nx;
      uVar10 = (long)(n_batch + -1 + iVar6 & -n_batch) / (long)n_batch;
      pfVar3 = (ctx->image_embd_v).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      bVar4 = mtmd_decode_use_non_causal(ctx);
      if (bVar4) {
        llama_set_causal_attn(lctx,0);
      }
      uVar8 = 0;
      while ((int)uVar8 < (int)uVar10) {
        uVar19 = iVar6 - uVar8 * n_batch;
        uVar20 = (ulong)uVar19;
        if (n_batch <= (int)uVar19) {
          uVar20 = (ulong)(uint)n_batch;
        }
        decode_embd_batch::decode_embd_batch
                  (&batch_img,pfVar3 + (int)(uVar8 * n_batch * iVar5),(int)uVar20,(int)uVar21,0);
        uVar19 = uVar8 + 1;
        printf("decoding image batch %d/%d, n_tokens_batch = %d\n",(ulong)uVar19,uVar10 & 0xffffffff
               ,uVar20);
        ggml_time_ms();
        iVar9 = llama_decode(lctx);
        if (iVar9 == 0) {
          if ((ctx->print_timings == true) && ((int)g_logger_state.verbosity_thold < 3)) {
            ggml_time_ms();
            clip_log_internal(GGML_LOG_LEVEL_INFO,"image decoded (batch %d/%d) in %ld ms\n",
                              (ulong)uVar19,uVar10 & 0xffffffff);
          }
          uVar21 = (ulong)(uint)((int)uVar21 + (int)uVar20);
          uVar8 = uVar19;
        }
        else {
          if ((int)g_logger_state.verbosity_thold < 5) {
            clip_log_internal(GGML_LOG_LEVEL_ERROR,"failed to decode image\n");
          }
          llama_set_causal_attn(lctx,1);
          llama_batch_free();
          local_158 = iVar9;
        }
        decode_embd_batch::~decode_embd_batch(&batch_img);
        if (iVar9 != 0) {
          return local_158;
        }
      }
      bVar4 = mtmd_decode_use_non_causal(ctx);
      if (bVar4) {
        llama_set_causal_attn(lctx,1);
      }
    }
    else {
      if (pmVar18->type != MTMD_INPUT_CHUNK_TYPE_TEXT) {
        pcVar14 = "false && \"chunk type not supported\"";
        uVar15 = 0x234;
        goto LAB_00138eaf;
      }
      text_batch.n_tokens =
           (int32_t)((ulong)((long)(pmVar18->tokens_text).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)(pmVar18->tokens_text).
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start) >> 2);
      uVar10 = 0;
      while( true ) {
        piVar16 = (pmVar18->tokens_text).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar17 = (pmVar18->tokens_text).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if ((ulong)((long)piVar17 - (long)piVar16 >> 2) <= uVar10) break;
        lVar11 = uVar10 * 4;
        lVar12 = 0;
        while ((uVar10 + lVar12 < (ulong)((long)piVar17 - (long)piVar16 >> 2) &&
               (text_batch.n_tokens < n_batch))) {
          *(int *)(CONCAT44(text_batch.token._4_4_,text_batch.token._0_4_) + lVar11 + lVar12 * 4) =
               piVar16[uVar10 + lVar12];
          *(int *)(CONCAT44(text_batch.pos._4_4_,text_batch.pos._0_4_) + lVar11 + lVar12 * 4) =
               (int)uVar21 + (int)lVar12;
          *(undefined4 *)
           (CONCAT44(text_batch.n_seq_id._4_4_,text_batch.n_seq_id._0_4_) + lVar11 + lVar12 * 4) = 1
          ;
          **(llama_seq_id **)
            (CONCAT44(text_batch.seq_id._4_4_,text_batch.seq_id._0_4_) + uVar10 * 8 + lVar12 * 8) =
               seq_id;
          text_batch.logits[lVar12 + uVar10] = '\0';
          piVar16 = (pmVar18->tokens_text).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          piVar17 = (pmVar18->tokens_text).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          lVar12 = lVar12 + 1;
        }
        if (pmVar18 == pmVar13) {
          text_batch.logits[(long)text_batch.n_tokens + -1] = '\x01';
        }
        uVar21 = (uVar21 & 0xffffffff) + lVar12;
        iVar6 = llama_decode(lctx);
        uVar10 = uVar10 + lVar12;
        if (iVar6 != 0) {
          if (4 < (int)g_logger_state.verbosity_thold) goto LAB_00138de7;
          pcVar14 = "failed to decode text\n";
          goto LAB_00138dda;
        }
      }
    }
    pmVar18 = pmVar18 + 1;
  } while( true );
}

Assistant:

int32_t mtmd_helper_eval(mtmd_context * ctx,
        llama_context * lctx,
        mtmd_input_chunks & chunks,
        llama_pos pos0,
        llama_seq_id seq_id,
        int32_t n_batch) {
    int32_t ret;
    llama_pos n_past = pos0;
    llama_batch text_batch = llama_batch_init(n_batch, 0, 1);
    int n_mmproj_embd = clip_n_mmproj_embd(ctx->ctx_clip);

    for (auto & chunk : chunks) {
        bool is_last = &chunk == &chunks.back();
        if (chunk.type == MTMD_INPUT_CHUNK_TYPE_TEXT) {
            text_batch.n_tokens = chunk.tokens_text.size();
            size_t i = 0;
            while (i < chunk.tokens_text.size()) { // split into batches
                for (; i < chunk.tokens_text.size() && text_batch.n_tokens < n_batch; i++) {
                    text_batch.token   [i]    = chunk.tokens_text[i];
                    text_batch.pos     [i]    = n_past++;
                    text_batch.n_seq_id[i]    = 1;
                    text_batch.seq_id  [i][0] = seq_id;
                    text_batch.logits  [i]    = false;
                }
                if (is_last) {
                    // always get logits for last input chunk
                    text_batch.logits[text_batch.n_tokens - 1] = true;
                }
                ret = llama_decode(lctx, text_batch);
                if (ret != 0) {
                    LOG_ERR("failed to decode text\n");
                    llama_batch_free(text_batch);
                    return ret;
                }
            }

        } else if (chunk.type == MTMD_INPUT_CHUNK_TYPE_IMAGE) {
            GGML_ASSERT(!is_last && "logits for last image chunk is not yet support");
            GGML_ASSERT(chunk.tokens_image != nullptr);
            int64_t t0 = ggml_time_ms();
            if (ctx->print_timings) {
                LOG_INF("encoding image or slice...\n");
            }
            ret = mtmd_encode(ctx, chunk.tokens_image.get());
            if (ret != 0) {
                LOG_ERR("failed to encode image\n");
                llama_batch_free(text_batch);
                return ret;
            }
            if (ctx->print_timings) {
                LOG_INF("image/slice encoded in %" PRId64 " ms\n", ggml_time_ms() - t0);
            }

            int32_t n_tokens = mtmd_image_tokens_get_n_tokens(chunk.tokens_image.get());
            int32_t i_batch = 0;
            int32_t n_img_batches = GGML_PAD(n_tokens, n_batch) / n_batch;
            float * embd = mtmd_get_output_embd(ctx);

            if (mtmd_decode_use_non_causal(ctx)) {
                llama_set_causal_attn(lctx, false);
                // TODO @ngxson : need to make sure only one image is processed at a time, and n_ubatch must be enough to hold the image
            }

            while (i_batch < n_img_batches) { // split into batches
                int32_t pos_offset = i_batch*n_batch;
                int32_t n_tokens_batch = std::min(n_batch, n_tokens - pos_offset);
                float * embd_batch = embd + pos_offset*n_mmproj_embd;
                decode_embd_batch batch_img(embd_batch, n_tokens_batch, n_past, 0);

                printf("decoding image batch %d/%d, n_tokens_batch = %d\n", i_batch+1, n_img_batches, n_tokens_batch);

                int64_t t1 = ggml_time_ms();
                ret = llama_decode(lctx, batch_img.batch);
                if (ret != 0) {
                    LOG_ERR("failed to decode image\n");
                    llama_set_causal_attn(lctx, true); // restore causal attn
                    llama_batch_free(text_batch);
                    return ret;
                }

                if (ctx->print_timings) {
                    LOG_INF("image decoded (batch %d/%d) in %" PRId64 " ms\n", i_batch+1, n_img_batches, ggml_time_ms() - t1);
                }

                i_batch++;
                n_past += n_tokens_batch;
            }

            if (mtmd_decode_use_non_causal(ctx)) {
                llama_set_causal_attn(lctx, true);
            }

        } else {
            GGML_ASSERT(false && "chunk type not supported");
        }
    }

    llama_batch_free(text_batch);
    return 0;
}